

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

int Timidity::update_signal(Voice *v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (((v->eg1).field_0.env.bUpdating != '\0') && (bVar1 = Envelope::Update(&v->eg1,v), bVar1)) {
    return 1;
  }
  if (v->tremolo_phase_increment != 0) {
    iVar3 = (uint)v->sample->tremolo_depth * 0x80;
    if (v->tremolo_sweep != 0) {
      iVar2 = v->tremolo_sweep + v->tremolo_sweep_position;
      v->tremolo_sweep_position = iVar2;
      if (iVar2 < 0x10000) {
        iVar3 = iVar2 * iVar3 >> 0x10;
      }
      else {
        v->tremolo_sweep = 0;
      }
    }
    iVar2 = v->tremolo_phase_increment + v->tremolo_phase;
    v->tremolo_phase = iVar2;
    dVar4 = sin((double)(iVar2 >> 5) * -0.006135923151542565);
    v->tremolo_volume = (float)((double)iVar3 * (dVar4 + -1.0)) * 7.6293945e-06 + 1.0;
  }
  Envelope::ApplyToAmp(&v->eg1,v);
  return 0;
}

Assistant:

static int update_signal(Voice *v)
{
	if (v->eg1.env.bUpdating && v->eg1.Update(v))
	{
		return 1;
	}
	if (v->tremolo_phase_increment != 0)
	{
		update_tremolo(v);
	}
	apply_envelope_to_amp(v);
	return 0;
}